

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

int Sfm_DecExtract(Abc_Ntk_t *pNtk,Sfm_Par_t *pPars,Abc_Obj_t *pPivot,Vec_Int_t *vRoots,
                  Vec_Int_t *vGates,Vec_Wec_t *vFanins,Vec_Int_t *vMap,Vec_Int_t *vTfi,
                  Vec_Int_t *vTfo,Vec_Int_t *vMffc,Vec_Int_t *vInMffc,Sfm_Tim_t *pTim,
                  Sfm_Mit_t *pMit)

{
  long *plVar1;
  void *pvVar2;
  Abc_Obj_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  Vec_Int_t *pVVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int local_48;
  
  if ((*(uint *)&pPivot->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x625,
                  "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                 );
  }
  uVar12 = *(uint *)&pPivot->field_0x14 >> 0xc;
  iVar7 = pPars->nTfoLevMax;
  iVar13 = uVar12 - pPars->nTfiLevMax;
  vTfo->nSize = 0;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar19 = pNtk->vObjs->nSize;
    uVar10 = (long)iVar19 + 500;
    iVar18 = (int)uVar10;
    if ((pNtk->vTravIds).nCap < iVar18) {
      piVar8 = (int *)malloc(uVar10 * 4);
      (pNtk->vTravIds).pArray = piVar8;
      if (piVar8 == (int *)0x0) goto LAB_0052c61e;
      (pNtk->vTravIds).nCap = iVar18;
    }
    else {
      piVar8 = (int *)0x0;
    }
    if (-500 < iVar19) {
      memset(piVar8,0,(uVar10 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar18;
  }
  iVar19 = pNtk->nTravIds;
  pNtk->nTravIds = iVar19 + 1;
  if (0x3ffffffe < iVar19) {
LAB_0052c564:
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  Abc_NtkDfsReverseOne_rec(pPivot,vTfo,iVar7 + uVar12,pPars->nFanoutMax);
  iVar7 = vTfo->nSize;
  if (0 < iVar7) {
    lVar9 = 0;
    do {
      iVar19 = vTfo->pArray[lVar9];
      if (((long)iVar19 < 0) || (pNtk->vObjs->nSize <= iVar19)) goto LAB_0052c4e8;
      plVar1 = (long *)pNtk->vObjs->pArray[iVar19];
      if ((plVar1 != (long *)0x0) && (0 < *(int *)((long)plVar1 + 0x1c))) {
        lVar14 = 0;
        do {
          piVar8 = (int *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                    (long)*(int *)(plVar1[4] + lVar14 * 4) * 8) + 0x40);
          *piVar8 = *piVar8 + 1;
          lVar14 = lVar14 + 1;
        } while (lVar14 < *(int *)((long)plVar1 + 0x1c));
        iVar7 = vTfo->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar7);
  }
  vRoots->nSize = 0;
  iVar7 = vTfo->nSize;
  if (iVar7 < 1) {
LAB_0052c583:
    __assert_fail("Vec_IntSize(vRoots) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x635,
                  "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                 );
  }
  lVar9 = 0;
  do {
    iVar19 = vTfo->pArray[lVar9];
    if (((long)iVar19 < 0) || (pNtk->vObjs->nSize <= iVar19)) goto LAB_0052c4e8;
    pvVar2 = pNtk->vObjs->pArray[iVar19];
    if ((pvVar2 != (void *)0x0) && (*(int *)((long)pvVar2 + 0x40) != *(int *)((long)pvVar2 + 0x2c)))
    {
      Vec_IntPush(vRoots,*(int *)((long)pvVar2 + 0x10));
      iVar7 = vTfo->nSize;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 < iVar7);
  if (vRoots->nSize < 1) goto LAB_0052c583;
  vTfi->nSize = 0;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar7 = pNtk->vObjs->nSize;
    uVar10 = (long)iVar7 + 500;
    iVar19 = (int)uVar10;
    if ((pNtk->vTravIds).nCap < iVar19) {
      piVar8 = (int *)malloc(uVar10 * 4);
      (pNtk->vTravIds).pArray = piVar8;
      if (piVar8 == (int *)0x0) {
LAB_0052c61e:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar19;
    }
    else {
      piVar8 = (int *)0x0;
    }
    if (-500 < iVar7) {
      memset(piVar8,0,(uVar10 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar19;
  }
  iVar7 = pNtk->nTravIds;
  pNtk->nTravIds = iVar7 + 1;
  if (0x3ffffffe < iVar7) goto LAB_0052c564;
  Abc_NtkDfsOne_rec(pPivot,vTfi,iVar13,1);
  uVar12 = vTfi->nSize;
  uVar10 = (ulong)uVar12;
  plVar1 = (long *)pPivot->pNtk->pData;
  lVar9 = *plVar1;
  if (*(int *)(lVar9 + 0x5c) != 0) {
    iVar7 = pPivot->Id;
    lVar9 = (long)iVar7;
    if ((lVar9 < 0) || (*(int *)((long)plVar1 + 0x144) <= iVar7)) {
LAB_0052c526:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
    }
    if (*(int *)((long)plVar1 + 0x154) <= iVar7) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
    }
    *(ulong *)(plVar1[0x2b] + lVar9 * 8) = ~*(ulong *)(plVar1[0x29] + lVar9 * 8);
  }
  Sfm_DecMarkMffc(pPivot,iVar13,pPars->nMffcMax,(int)lVar9,vMffc,vInMffc,pTim,pMit);
  if (pPars->nMffcMax < vMffc->nSize) {
    __assert_fail("Vec_IntSize(vMffc) <= pPars->nMffcMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x63e,
                  "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                 );
  }
  iVar7 = vRoots->nSize;
  if (0 < iVar7) {
    lVar9 = 0;
    do {
      iVar19 = vRoots->pArray[lVar9];
      if (((long)iVar19 < 0) || (pNtk->vObjs->nSize <= iVar19)) goto LAB_0052c4e8;
      pAVar3 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar19];
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        Abc_NtkDfsOne_rec(pAVar3,vTfi,iVar13,2);
        iVar7 = vRoots->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar7);
  }
  iVar7 = vTfi->nSize;
  if ((int)uVar12 < iVar7) {
    do {
      if ((int)uVar12 < 0) goto LAB_0052c507;
      iVar19 = vTfi->pArray[uVar10];
      if (((long)iVar19 < 0) || (pNtk->vObjs->nSize <= iVar19)) goto LAB_0052c4e8;
      plVar1 = (long *)pNtk->vObjs->pArray[iVar19];
      if ((plVar1 != (long *)0x0) &&
         (((int)plVar1[8] != 2 && (iVar19 = *(int *)((long)plVar1 + 0x1c), 0 < iVar19)))) {
        lVar9 = 0;
        do {
          lVar14 = *(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                            (long)*(int *)(plVar1[4] + lVar9 * 4) * 8);
          if (*(int *)(lVar14 + 0x40) == 2) {
            *(undefined4 *)(lVar14 + 0x40) = 4;
            iVar19 = *(int *)((long)plVar1 + 0x1c);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < iVar19);
        iVar7 = vTfi->nSize;
      }
      uVar10 = uVar10 + 1;
    } while ((int)uVar10 < iVar7);
  }
  vMap->nSize = 0;
  vGates->nSize = 0;
  iVar7 = vTfi->nSize;
  if (iVar7 < 1) {
    local_48 = vMap->nSize;
  }
  else {
    lVar9 = 0;
    do {
      iVar19 = vTfi->pArray[lVar9];
      if (((long)iVar19 < 0) || (pNtk->vObjs->nSize <= iVar19)) goto LAB_0052c4e8;
      pAVar3 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar19];
      if ((pAVar3 != (Abc_Obj_t *)0x0) && ((pAVar3->field_6).iTemp == 1)) {
        uVar15 = *(uint *)&pAVar3->field_0x14 & 0xf;
        uVar12 = 1;
        if (((uVar15 != 2) && (uVar15 != 5)) &&
           (uVar12 = 0, (int)(*(uint *)&pAVar3->field_0x14 >> 0xc) < iVar13)) {
          uVar12 = (uint)(0 < (pAVar3->vFanins).nSize);
        }
        Sfm_DecAddNode(pAVar3,vMap,vGates,uVar12,0);
        iVar7 = vTfi->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar7);
    local_48 = vMap->nSize;
    if (0 < iVar7) {
      lVar9 = 0;
      do {
        iVar19 = vTfi->pArray[lVar9];
        if (((long)iVar19 < 0) || (pNtk->vObjs->nSize <= iVar19)) goto LAB_0052c4e8;
        pAVar3 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar19];
        if ((pAVar3 != (Abc_Obj_t *)0x0) && ((pAVar3->field_6).iTemp - 3U < 2)) {
          Sfm_DecAddNode(pAVar3,vMap,vGates,(uint)((pAVar3->field_6).iTemp == 4),0);
          iVar7 = vTfi->nSize;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar7);
    }
  }
  if (pMit == (Sfm_Mit_t *)0x0) {
    if (pTim != (Sfm_Tim_t *)0x0) {
      iVar7 = vMap->nSize;
      vTfo->nSize = 0;
      if (0 < vMap->nSize) {
        lVar9 = 0;
        do {
          Vec_IntPush(vTfo,vMap->pArray[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 < vMap->nSize);
      }
      local_48 = Sfm_TimSortArrayByArrival(pTim,vTfo,pPivot->Id);
      vMap->nSize = 0;
      vGates->nSize = 0;
      iVar19 = vTfo->nSize;
      if (0 < iVar19) {
        lVar9 = 0;
        do {
          iVar18 = vTfo->pArray[lVar9];
          if (((long)iVar18 < 0) || (pNtk->vObjs->nSize <= iVar18)) goto LAB_0052c4e8;
          pAVar3 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar18];
          if (pAVar3 != (Abc_Obj_t *)0x0) {
            uVar15 = *(uint *)&pAVar3->field_0x14 & 0xf;
            uVar12 = 1;
            if (((uVar15 != 2) && (uVar15 != 5)) &&
               ((iVar13 <= (int)(*(uint *)&pAVar3->field_0x14 >> 0xc) ||
                ((pAVar3->vFanins).nSize < 1)))) {
              uVar12 = (uint)((pAVar3->field_6).iTemp == 4);
            }
            Sfm_DecAddNode(pAVar3,vMap,vGates,uVar12,0);
            iVar19 = vTfo->nSize;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < iVar19);
      }
      if (iVar7 != vMap->nSize) {
        __assert_fail("nOldSize == Vec_IntSize(vMap)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                      ,0x674,
                      "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                     );
      }
    }
  }
  else {
    iVar7 = vMap->nSize;
    vTfo->nSize = 0;
    if (0 < vMap->nSize) {
      lVar9 = 0;
      do {
        Vec_IntPush(vTfo,vMap->pArray[lVar9]);
        lVar9 = lVar9 + 1;
      } while (lVar9 < vMap->nSize);
    }
    local_48 = Sfm_MitSortArrayByArrival(pMit,vTfo,pPivot->Id);
    vMap->nSize = 0;
    vGates->nSize = 0;
    iVar19 = vTfo->nSize;
    if (0 < iVar19) {
      lVar9 = 0;
      do {
        iVar18 = vTfo->pArray[lVar9];
        if (((long)iVar18 < 0) || (pNtk->vObjs->nSize <= iVar18)) goto LAB_0052c4e8;
        pAVar3 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar18];
        if (pAVar3 != (Abc_Obj_t *)0x0) {
          uVar15 = *(uint *)&pAVar3->field_0x14 & 0xf;
          uVar12 = 1;
          if (((uVar15 != 2) && (uVar15 != 5)) &&
             ((iVar13 <= (int)(*(uint *)&pAVar3->field_0x14 >> 0xc) || ((pAVar3->vFanins).nSize < 1)
              ))) {
            uVar12 = (uint)((pAVar3->field_6).iTemp == 4);
          }
          Sfm_DecAddNode(pAVar3,vMap,vGates,uVar12,0);
          iVar19 = vTfo->nSize;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar19);
    }
    if (iVar7 != vMap->nSize) {
      __assert_fail("nOldSize == Vec_IntSize(vMap)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                    ,0x665,
                    "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                   );
    }
  }
  iVar7 = vTfi->nSize;
  if (0 < iVar7) {
    lVar9 = 0;
    do {
      iVar13 = vTfi->pArray[lVar9];
      if (((long)iVar13 < 0) || (pNtk->vObjs->nSize <= iVar13)) goto LAB_0052c4e8;
      pvVar2 = pNtk->vObjs->pArray[iVar13];
      if ((pvVar2 != (void *)0x0) && (7 < *(int *)((long)pvVar2 + 0x40))) {
        Vec_IntPush(vMap,*(int *)((long)pvVar2 + 0x10));
        iVar7 = Mio_GateReadValue(*(Mio_Gate_t **)((long)pvVar2 + 0x38));
        Vec_IntPush(vGates,iVar7);
        iVar7 = vTfi->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar7);
  }
  auVar6 = _DAT_0093d220;
  iVar7 = vMap->nSize;
  if (iVar7 != vGates->nSize) {
    __assert_fail("Vec_IntSize(vMap) == Vec_IntSize(vGates)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x67e,
                  "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                 );
  }
  iVar13 = vFanins->nSize;
  if (0 < (long)iVar13) {
    pVVar11 = vFanins->pArray;
    lVar9 = (long)iVar13 + -1;
    auVar20._8_4_ = (int)lVar9;
    auVar20._0_8_ = lVar9;
    auVar20._12_4_ = (int)((ulong)lVar9 >> 0x20);
    lVar9 = 0;
    auVar20 = auVar20 ^ _DAT_0093d220;
    auVar21 = _DAT_0093e4e0;
    auVar22 = _DAT_0093d210;
    do {
      auVar23 = auVar22 ^ auVar6;
      iVar7 = auVar20._4_4_;
      if ((bool)(~(auVar23._4_4_ == iVar7 && auVar20._0_4_ < auVar23._0_4_ || iVar7 < auVar23._4_4_)
                & 1)) {
        *(undefined4 *)((long)&pVVar11->nSize + lVar9) = 0;
      }
      if ((auVar23._12_4_ != auVar20._12_4_ || auVar23._8_4_ <= auVar20._8_4_) &&
          auVar23._12_4_ <= auVar20._12_4_) {
        *(undefined4 *)((long)&pVVar11[1].nSize + lVar9) = 0;
      }
      auVar23 = auVar21 ^ auVar6;
      iVar19 = auVar23._4_4_;
      if (iVar19 <= iVar7 && (iVar19 != iVar7 || auVar23._0_4_ <= auVar20._0_4_)) {
        *(undefined4 *)((long)&pVVar11[2].nSize + lVar9) = 0;
        *(undefined4 *)((long)&pVVar11[3].nSize + lVar9) = 0;
      }
      lVar14 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 4;
      auVar22._8_8_ = lVar14 + 4;
      lVar14 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 4;
      auVar21._8_8_ = lVar14 + 4;
      lVar9 = lVar9 + 0x40;
    } while ((ulong)(iVar13 + 3U >> 2) << 6 != lVar9);
    iVar7 = vMap->nSize;
  }
  vFanins->nSize = 0;
  if (0 < iVar7) {
    lVar9 = 0;
    do {
      iVar7 = vMap->pArray[lVar9];
      if (((long)iVar7 < 0) || (pNtk->vObjs->nSize <= iVar7)) goto LAB_0052c4e8;
      plVar1 = (long *)pNtk->vObjs->pArray[iVar7];
      if (plVar1 != (long *)0x0) {
        *(int *)(plVar1 + 8) = (int)lVar9;
        uVar12 = vFanins->nSize;
        if (uVar12 == vFanins->nCap) {
          if ((int)uVar12 < 0x10) {
            if (vFanins->pArray == (Vec_Int_t *)0x0) {
              pVVar11 = (Vec_Int_t *)malloc(0x100);
            }
            else {
              pVVar11 = (Vec_Int_t *)realloc(vFanins->pArray,0x100);
              uVar12 = vFanins->nCap;
            }
            vFanins->pArray = pVVar11;
            iVar13 = 0x10 - uVar12;
            pVVar11 = pVVar11 + (int)uVar12;
            iVar7 = 0x10;
          }
          else {
            if (vFanins->pArray == (Vec_Int_t *)0x0) {
              pVVar11 = (Vec_Int_t *)malloc((ulong)uVar12 << 5);
              uVar15 = uVar12;
            }
            else {
              pVVar11 = (Vec_Int_t *)realloc(vFanins->pArray,(ulong)uVar12 << 5);
              uVar15 = vFanins->nCap;
            }
            iVar7 = uVar12 * 2;
            vFanins->pArray = pVVar11;
            iVar13 = iVar7 - uVar15;
            pVVar11 = pVVar11 + (int)uVar15;
          }
          memset(pVVar11,0,(long)iVar13 << 4);
          vFanins->nCap = iVar7;
          uVar12 = vFanins->nSize;
        }
        vFanins->nSize = uVar12 + 1;
        if ((int)uVar12 < 0) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
        }
        if (vGates->nSize <= lVar9) {
LAB_0052c507:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((-1 < vGates->pArray[lVar9]) && (0 < *(int *)((long)plVar1 + 0x1c))) {
          pVVar11 = vFanins->pArray;
          lVar14 = 0;
          do {
            Vec_IntPush(pVVar11 + ((ulong)(uVar12 + 1) - 1),
                        *(int *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                          (long)*(int *)(plVar1[4] + lVar14 * 4) * 8) + 0x40));
            lVar14 = lVar14 + 1;
          } while (lVar14 < *(int *)((long)plVar1 + 0x1c));
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < vMap->nSize);
  }
  pAVar4 = pPivot->pNtk;
  if (pAVar4->vPis->nSize < 1) {
LAB_0052c4e8:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  plVar1 = *(long **)(**pAVar4->vPis->pArray + 0x158);
  uVar12 = vRoots->nSize;
  uVar10 = (ulong)uVar12;
  if (*(int *)(*plVar1 + 0x5c) == 0) {
    uVar16 = 0;
  }
  else {
    if ((int)uVar12 < 1) {
      *(undefined8 *)((long)pAVar4->pData + 200) = 0;
      goto LAB_0052c493;
    }
    uVar17 = 0;
    uVar16 = 0;
    do {
      iVar7 = vRoots->pArray[uVar17];
      if (((long)iVar7 < 0) || (pAVar4->vObjs->nSize <= iVar7)) goto LAB_0052c4e8;
      pvVar2 = pAVar4->vObjs->pArray[iVar7];
      if (pvVar2 != (void *)0x0) {
        iVar7 = *(int *)((long)pvVar2 + 0x10);
        lVar9 = (long)iVar7;
        if (((lVar9 < 0) || (*(int *)((long)plVar1 + 0x144) <= iVar7)) ||
           (*(int *)((long)plVar1 + 0x154) <= iVar7)) goto LAB_0052c526;
        uVar16 = uVar16 | *(ulong *)(plVar1[0x2b] + lVar9 * 8) ^
                          *(ulong *)(plVar1[0x29] + lVar9 * 8);
      }
      uVar17 = uVar17 + 1;
    } while (uVar10 != uVar17);
  }
  *(ulong *)((long)pAVar4->pData + 200) = uVar16;
  if (0 < (int)uVar12) {
    piVar8 = vRoots->pArray;
    pVVar5 = pNtk->vObjs;
    lVar9 = 0;
    do {
      iVar7 = piVar8[lVar9];
      if (((long)iVar7 < 0) || (pVVar5->nSize <= iVar7)) goto LAB_0052c4e8;
      pvVar2 = pVVar5->pArray[iVar7];
      if (pvVar2 != (void *)0x0) {
        piVar8[lVar9] = *(int *)((long)pvVar2 + 0x40);
        uVar10 = (ulong)(uint)vRoots->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)uVar10);
  }
LAB_0052c493:
  iVar7 = vInMffc->nSize;
  if (0 < iVar7) {
    piVar8 = vInMffc->pArray;
    pVVar5 = pNtk->vObjs;
    lVar9 = 0;
    do {
      iVar13 = piVar8[lVar9];
      if (((long)iVar13 < 0) || (pVVar5->nSize <= iVar13)) goto LAB_0052c4e8;
      pvVar2 = pVVar5->pArray[iVar13];
      if (pvVar2 != (void *)0x0) {
        piVar8[lVar9] = *(int *)((long)pvVar2 + 0x40);
        iVar7 = vInMffc->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar7);
  }
  return local_48;
}

Assistant:

int Sfm_DecExtract( Abc_Ntk_t * pNtk, Sfm_Par_t * pPars, Abc_Obj_t * pPivot, Vec_Int_t * vRoots, Vec_Int_t * vGates, Vec_Wec_t * vFanins, Vec_Int_t * vMap, Vec_Int_t * vTfi, Vec_Int_t * vTfo, Vec_Int_t * vMffc, Vec_Int_t * vInMffc, Sfm_Tim_t * pTim, Sfm_Mit_t * pMit )
{
    int fVeryVerbose = 0;//pPars->fVeryVerbose;
    Vec_Int_t * vLevel;
    Abc_Obj_t * pObj, * pFanin;
    int nLevelMax = pPivot->Level + pPars->nTfoLevMax;
    int nLevelMin = pPivot->Level - pPars->nTfiLevMax;
    int i, k, nTfiSize, nDivs = -1;
    assert( Abc_ObjIsNode(pPivot) );
if ( fVeryVerbose )
printf( "\n\nTarget %d\n", Abc_ObjId(pPivot) );
    // collect TFO nodes
    Vec_IntClear( vTfo );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkDfsReverseOne_rec( pPivot, vTfo, nLevelMax, pPars->nFanoutMax );
    // count internal fanouts
    Abc_NtkForEachObjVec( vTfo, pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            pFanin->iTemp++;
    // compute roots
    Vec_IntClear( vRoots );
    Abc_NtkForEachObjVec( vTfo, pNtk, pObj, i )
        if ( pObj->iTemp != Abc_ObjFanoutNum(pObj) )
            Vec_IntPush( vRoots, Abc_ObjId(pObj) );
    assert( Vec_IntSize(vRoots) > 0 );
    // collect TFI and mark nodes
    Vec_IntClear( vTfi );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkDfsOne_rec( pPivot, vTfi, nLevelMin, SFM_MASK_PI );
    nTfiSize = Vec_IntSize(vTfi);
    Sfm_ObjFlipNode( pPivot );
    // additinally mark MFFC
    Sfm_DecMarkMffc( pPivot, nLevelMin, pPars->nMffcMax, fVeryVerbose, vMffc, vInMffc, pTim, pMit );
    assert( Vec_IntSize(vMffc) <= pPars->nMffcMax );
if ( fVeryVerbose )
printf( "Mffc size = %d. Mffc area = %.2f. InMffc size = %d.\n", Vec_IntSize(vMffc), Scl_Int2Flt(Sfm_DecMffcArea(pNtk, vMffc)), Vec_IntSize(vInMffc) );
    // collect TFI(TFO)
    Abc_NtkForEachObjVec( vRoots, pNtk, pObj, i )
        Abc_NtkDfsOne_rec( pObj, vTfi, nLevelMin, SFM_MASK_INPUT );
    // mark input-only nodes pointed to by mixed nodes
    Abc_NtkForEachObjVecStart( vTfi, pNtk, pObj, i, nTfiSize )
        if ( pObj->iTemp != SFM_MASK_INPUT )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                if ( pFanin->iTemp == SFM_MASK_INPUT )
                    pFanin->iTemp = SFM_MASK_FANIN;
    // collect nodes supported only on TFI fanins and not MFFC
if ( fVeryVerbose )
printf( "\nDivs:\n" );
    Vec_IntClear( vMap );
    Vec_IntClear( vGates );
    Abc_NtkForEachObjVec( vTfi, pNtk, pObj, i )
        if ( pObj->iTemp == SFM_MASK_PI )
            Sfm_DecAddNode( pObj, vMap, vGates, Abc_ObjIsCi(pObj) || (Abc_ObjLevel(pObj) < nLevelMin && Abc_ObjFaninNum(pObj) > 0), fVeryVerbose );
    nDivs = Vec_IntSize(vMap);
    // add other nodes that are not in TFO and not in MFFC
if ( fVeryVerbose )
printf( "\nSides:\n" );
    Abc_NtkForEachObjVec( vTfi, pNtk, pObj, i )
        if ( pObj->iTemp == (SFM_MASK_PI | SFM_MASK_INPUT) || pObj->iTemp == SFM_MASK_FANIN )
            Sfm_DecAddNode( pObj, vMap, vGates, pObj->iTemp == SFM_MASK_FANIN, fVeryVerbose );
    // reorder nodes acording to delay
    if ( pMit )
    {
        int nDivsNew, nOldSize = Vec_IntSize(vMap);
        Vec_IntClear( vTfo );
        Vec_IntAppend( vTfo, vMap );
        nDivsNew = Sfm_MitSortArrayByArrival( pMit, vTfo, Abc_ObjId(pPivot) );
        // collect again
        Vec_IntClear( vMap );
        Vec_IntClear( vGates );
        Abc_NtkForEachObjVec( vTfo, pNtk, pObj, i )
            Sfm_DecAddNode( pObj, vMap, vGates, Abc_ObjIsCi(pObj) || (Abc_ObjLevel(pObj) < nLevelMin && Abc_ObjFaninNum(pObj) > 0) || pObj->iTemp == SFM_MASK_FANIN, 0 );
        assert( nOldSize == Vec_IntSize(vMap) );
        // update divisor count
        nDivs = nDivsNew;
    }
    else if ( pTim )
    {
        int nDivsNew, nOldSize = Vec_IntSize(vMap);
        Vec_IntClear( vTfo );
        Vec_IntAppend( vTfo, vMap );
        nDivsNew = Sfm_TimSortArrayByArrival( pTim, vTfo, Abc_ObjId(pPivot) );
        // collect again
        Vec_IntClear( vMap );
        Vec_IntClear( vGates );
        Abc_NtkForEachObjVec( vTfo, pNtk, pObj, i )
            Sfm_DecAddNode( pObj, vMap, vGates, Abc_ObjIsCi(pObj) || (Abc_ObjLevel(pObj) < nLevelMin && Abc_ObjFaninNum(pObj) > 0) || pObj->iTemp == SFM_MASK_FANIN, 0 );
        assert( nOldSize == Vec_IntSize(vMap) );
        // update divisor count
        nDivs = nDivsNew;
    }
    // add the TFO nodes
if ( fVeryVerbose )
printf( "\nTFO:\n" );
    Abc_NtkForEachObjVec( vTfi, pNtk, pObj, i )
        if ( pObj->iTemp >= SFM_MASK_MFFC )
            Sfm_DecAddNode( pObj, vMap, vGates, 0, fVeryVerbose );
    assert( Vec_IntSize(vMap) == Vec_IntSize(vGates) );
if ( fVeryVerbose )
printf( "\n" );
    // create node IDs
    Vec_WecClear( vFanins );
    Abc_NtkForEachObjVec( vMap, pNtk, pObj, i )
    {
        pObj->iTemp = i;
        vLevel = Vec_WecPushLevel( vFanins );
        if ( Vec_IntEntry(vGates, i) >= 0 )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Vec_IntPush( vLevel, pFanin->iTemp );
    }
    // compute care set
    Sfm_DecMan(pPivot)->uCareSet = Sfm_ObjFindCareSet(pPivot->pNtk, vRoots);

    //printf( "care = %5d : ", Abc_ObjId(pPivot) );
    //Extra_PrintBinary( stdout, (unsigned *)&Sfm_DecMan(pPivot)->uCareSet, 64 );
    //printf( "\n" );

    // remap roots
    Abc_NtkForEachObjVec( vRoots, pNtk, pObj, i )
        Vec_IntWriteEntry( vRoots, i, pObj->iTemp );
    // remap inputs to MFFC
    Abc_NtkForEachObjVec( vInMffc, pNtk, pObj, i )
        Vec_IntWriteEntry( vInMffc, i, pObj->iTemp );

/*
    // check
    Abc_NtkForEachObjVec( vMap, pNtk, pObj, i )
    {
        if ( i == nDivs )
            break;
        Abc_NtkIncrementTravId( pNtk );
        assert( Abc_NtkDfsCheck_rec(pObj, pPivot) );
    }
*/  
    return nDivs;
}